

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeParser.cpp
# Opt level: O1

void __thiscall antlr::TreeParser::traceOut(TreeParser *this,char *rname,RefAST *t)

{
  int iVar1;
  ASTRef *pAVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  long *__s;
  bool bVar6;
  long *local_48 [2];
  long local_38 [2];
  
  (*this->_vptr_TreeParser[0xc])();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"< ",2);
  if (rname == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x315428);
  }
  else {
    sVar3 = strlen(rname);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,rname,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
  pAVar2 = t->ref;
  if (pAVar2 == (ASTRef *)0x0) {
    bVar6 = true;
  }
  else {
    bVar6 = pAVar2->ptr == (AST *)0x0;
  }
  if (bVar6) {
    __s = (long *)"null";
  }
  else {
    (*pAVar2->ptr->_vptr_AST[0x18])(local_48);
    __s = local_48[0];
  }
  if (__s == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x315428);
  }
  else {
    sVar3 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
  iVar1 = ((this->inputState).ref)->ptr->guessing;
  pcVar5 = "";
  if (0 < iVar1) {
    pcVar5 = " [guessing]";
  }
  lVar4 = 0xb;
  if (iVar1 < 1) {
    lVar4 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  if ((!bVar6) && (local_48[0] != local_38)) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  this->traceDepth = this->traceDepth + -1;
  return;
}

Assistant:

void TreeParser::traceOut(const char* rname, RefAST t)
{
	traceIndent();

	ANTLR_USE_NAMESPACE(std)cout << "< " << rname
			<< "(" << (t ? t->toString().c_str() : "null") << ")"
			<< ((inputState->guessing>0)?" [guessing]":"")
			<< ANTLR_USE_NAMESPACE(std)endl;

	traceDepth--;
}